

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  long lVar2;
  string name;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"<unknown signal>",&local_29);
  lVar2 = 0;
  do {
    if (lVar2 + 0x10 == 0x70) goto LAB_001215c5;
    piVar1 = (int *)((long)&signalDefs + lVar2);
    lVar2 = lVar2 + 0x10;
  } while (*piVar1 != sig);
  std::__cxx11::string::assign((char *)&local_28);
LAB_001215c5:
  reset();
  reportFatal(&local_28);
  raise(sig);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void handleSignal( int sig ) {
            std::string name = "<unknown signal>";
            for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i) {
                SignalDefs &def = signalDefs[i];
                if (sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise( sig );
        }